

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O2

Word16 div_s(tetra_codec *st,Word16 var1,Word16 var2)

{
  int L_var1;
  Word16 var_out;
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  bool bVar4;
  
  uVar1 = 0;
  uVar2 = 0;
  if ((((var1 != 0) && (uVar2 = uVar1, var2 != 0)) && (var1 <= var2)) &&
     ((-1 < (short)(var2 | var1) && (uVar2 = 0x7fff, var1 != var2)))) {
    L_var1 = (int)var1;
    sVar3 = 0xf;
    uVar2 = 0;
    while (bVar4 = sVar3 != 0, sVar3 = sVar3 + -1, bVar4) {
      uVar2 = uVar2 * 2;
      L_var1 = L_var1 * 2;
      if (var2 <= L_var1) {
        L_var1 = L_sub(st,L_var1,(int)var2);
        uVar2 = uVar2 | 1;
        st->Overflow = 0;
      }
    }
  }
  return uVar2;
}

Assistant:

Word16 div_s(tetra_codec* st, Word16 var1, Word16 var2)
  {
   Word16 var_out = 0;
   Word16 iteration;
   Word32 L_num;
   Word32 L_denom;

   if ((var1 > var2) || (var1 < 0) || (var2 < 0))
     {
      //printf("Division Error\n");
      //exit(0);
	  return 0;
     }

   if (var2 == 0)
     {
      //printf("Division by 0, Fatal error \n");
      //exit(0);
	  return 0;
     }

   if (var1 == 0)
     {
      var_out = 0;
     }
   else
     {
      if (var1 == var2)
 {
  var_out = MAX_16;
 }
      else
 {
  L_num = L_deposit_l(var1);
  L_denom = L_deposit_l(var2);

  for(iteration=0;iteration<15;iteration++)
    {
     var_out <<=1;
     L_num <<= 1;

     if (L_num >= L_denom)
       {
        L_num = L_sub(st, L_num,L_denom);
        var_out = add(st,  var_out,(Word16)1 );
       }
    }
 }
     }

   return(var_out);
  }